

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
helics::apps::TemplateMatcher::isTemplateMatch
          (optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
           *__return_storage_ptr__,TemplateMatcher *this,string_view testString)

{
  pointer pbVar1;
  optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *poVar2;
  const_iterator cVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *intermedial;
  pointer pbVar4;
  long lVar5;
  char *pcVar6;
  value_type_conflict4 *__x;
  size_type __pos;
  char *pcVar7;
  size_t sVar8;
  size_t index;
  vector<unsigned_long,_std::allocator<unsigned_long>_> intermediateIndices;
  basic_string_view<char,_std::char_traits<char>_> tString;
  value_type_conflict4 local_78;
  optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_70;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_50._M_str = testString._M_str;
  local_50._M_len = testString._M_len;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = __return_storage_ptr__;
  CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,
             (long)(this->intermediaries).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->intermediaries).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_78 = 0;
  pbVar1 = (this->intermediaries).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (this->intermediaries).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    if (pbVar4->_M_string_length == 0) {
      __x = &local_78;
      if (local_68._M_impl.super__Vector_impl_data._M_start !=
          local_68._M_impl.super__Vector_impl_data._M_finish) {
        __x = &std::__cxx11::string::npos;
      }
      CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,__x);
    }
    else {
      local_78 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                           (&local_50,(pbVar4->_M_dataplus)._M_p,local_78,pbVar4->_M_string_length);
      if (local_78 == 0xffffffffffffffff) goto LAB_001b18db;
      CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,&local_78);
      local_78 = local_78 + pbVar4->_M_string_length;
    }
  }
  pcVar7 = (char *)0x0;
  lVar5 = 0;
  pcVar6 = (char *)0x0;
  sVar8 = 0;
  for (local_78 = 0;
      local_78 <
      ((long)local_68._M_impl.super__Vector_impl_data._M_finish -
       (long)local_68._M_impl.super__Vector_impl_data._M_start >> 3) - 1U; local_78 = local_78 + 1)
  {
    __pos = (this->intermediaries).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[local_78]._M_string_length +
            local_68._M_impl.super__Vector_impl_data._M_start[local_78];
    local_40 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_50,__pos,
                          local_68._M_impl.super__Vector_impl_data._M_start[local_78 + 1] - __pos);
    cVar3 = CLI::std::
            _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->templatePossibilities).
                    super__Vector_base<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_78]._M_h,&local_40);
    if (cVar3.
        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
        ._M_cur == (__node_type *)0x0) goto LAB_001b18db;
    if (*(size_t *)
         ((long)cVar3.
                super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                ._M_cur + 0x20) != 0) {
      pcVar7 = *(char **)((long)cVar3.
                                super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                                ._M_cur + 0x18);
      sVar8 = *(size_t *)
               ((long)cVar3.
                      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                      ._M_cur + 0x20);
    }
    if (*(long *)((long)cVar3.
                        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                        ._M_cur + 0x40) != 0) {
      pcVar6 = *(char **)((long)cVar3.
                                super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                                ._M_cur + 0x38);
      lVar5 = *(long *)((long)cVar3.
                              super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                              ._M_cur + 0x40);
    }
  }
  (local_70->
  super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
  )._M_payload.
  super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_payload._M_value.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_len = local_50._M_len;
  *(char **)((long)&(local_70->
                    super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                    )._M_payload.
                    super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_payload._M_value.
                    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    .
                    super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                    ._M_head_impl + 8) = local_50._M_str;
  *(long *)&(local_70->
            super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
            )._M_payload.
            super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_payload._M_value.
            super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            .
            super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_> = lVar5;
  *(char **)((long)&(local_70->
                    super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                    )._M_payload.
                    super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_payload._M_value.
                    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    .
                    super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>
            + 8) = pcVar6;
  (local_70->
  super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
  )._M_payload.
  super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_payload._M_value.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  .
  super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_len = sVar8;
  *(char **)((long)&(local_70->
                    super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
                    )._M_payload.
                    super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_payload._M_value.
                    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    .
                    super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    .
                    super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
            + 8) = pcVar7;
  (local_70->
  super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
  )._M_payload.
  super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_engaged = true;
LAB_001b190a:
  poVar2 = local_70;
  CLI::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_68);
  return poVar2;
LAB_001b18db:
  (local_70->
  super__Optional_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true,_false>
  )._M_payload.
  super__Optional_payload_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_engaged = false;
  goto LAB_001b190a;
}

Assistant:

std::optional<std::tuple<std::string_view, std::string_view, std::string_view>>
    TemplateMatcher::isTemplateMatch(std::string_view testString) const
{
    std::vector<std::size_t> intermediateIndices;
    intermediateIndices.reserve(intermediaries.size());
    std::size_t index{0};
    for (const auto& intermedial : intermediaries) {
        if (intermedial.empty()) {
            if (intermediateIndices.empty()) {
                intermediateIndices.push_back(index);
            } else {
                intermediateIndices.push_back(std::string::npos);
            }

        } else {
            index = testString.find_first_of(intermedial, index);
            if (index == std::string_view::npos) {
                return std::nullopt;
            }
            intermediateIndices.push_back(index);
            index += intermedial.size();
        }
    }
    index = 0;
    std::string_view iType;
    std::string_view iUnits;
    while (index < intermediateIndices.size() - 1) {
        auto index1 = intermediateIndices[index] + intermediaries[index].size();
        auto length = intermediateIndices[index + 1] - index1;
        auto tString = testString.substr(index1, length);
        auto loc = templatePossibilities[index].find(tString);
        if (loc == templatePossibilities[index].end()) {
            return std::nullopt;
        }
        if (!loc->second.first.empty()) {
            iType = loc->second.first;
        }
        if (!loc->second.second.empty()) {
            iUnits = loc->second.second;
        }
        ++index;
    }
    return {std::make_tuple(testString, iType, iUnits)};
}